

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d603ce::SegmentTree::SegmentTree(SegmentTree *this,QPathSegments *segments)

{
  long lVar1;
  QList<(anonymous_namespace)::TreeNode> *this_00;
  qsizetype qVar2;
  reference piVar3;
  QRectF *this_01;
  reference pTVar4;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  double dVar5;
  qreal qVar6;
  QRectF *segmentBounds;
  int i;
  TreeNode root;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 uVar7;
  QPathSegments *in_stack_ffffffffffffff80;
  QList<(anonymous_namespace)::TreeNode> *this_02;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QList<int> *in_stack_ffffffffffffff90;
  int local_4c;
  RectF *bounds;
  undefined1 *puVar8;
  SegmentTree *this_03;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  QList<int>::QList((QList<int> *)0x5cd98d);
  QList<(anonymous_namespace)::TreeNode>::QList((QList<(anonymous_namespace)::TreeNode> *)0x5cd99b);
  QDataBuffer<QIntersection>::QDataBuffer
            ((QDataBuffer<QIntersection> *)in_stack_ffffffffffffff80,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  dVar5 = qt_inf();
  in_RDI[4] = dVar5;
  dVar5 = qt_inf();
  in_RDI[5] = dVar5;
  dVar5 = qt_inf();
  in_RDI[6] = -dVar5;
  dVar5 = qt_inf();
  in_RDI[7] = -dVar5;
  QPathSegments::segments((QPathSegments *)0x5cda2b);
  QList<int>::resize(in_stack_ffffffffffffff90,
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_4c = 0;
  while( true ) {
    this_00 = (QList<(anonymous_namespace)::TreeNode> *)(long)local_4c;
    qVar2 = QList<int>::size((QList<int> *)(in_RDI + 1));
    if (qVar2 <= (long)this_00) break;
    in_stack_ffffffffffffff8c = local_4c;
    piVar3 = QList<int>::operator[]
                       ((QList<int> *)in_stack_ffffffffffffff80,
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    *piVar3 = in_stack_ffffffffffffff8c;
    this_01 = QPathSegments::elementBounds(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    qVar6 = QRectF::left(this_01);
    if (qVar6 < (double)in_RDI[4]) {
      qVar6 = QRectF::left(this_01);
      in_RDI[4] = qVar6;
    }
    qVar6 = QRectF::top(this_01);
    if (qVar6 < (double)in_RDI[5]) {
      qVar6 = QRectF::top(this_01);
      in_RDI[5] = qVar6;
    }
    qVar6 = QRectF::right(this_01);
    if ((double)in_RDI[6] <= qVar6 && qVar6 != (double)in_RDI[6]) {
      qVar6 = QRectF::right(this_01);
      in_RDI[6] = qVar6;
    }
    qVar6 = QRectF::bottom(this_01);
    if ((double)in_RDI[7] <= qVar6 && qVar6 != (double)in_RDI[7]) {
      qVar6 = QRectF::bottom(this_01);
      in_RDI[7] = qVar6;
    }
    local_4c = local_4c + 1;
  }
  this_02 = (QList<(anonymous_namespace)::TreeNode> *)(in_RDI + 8);
  QList<(anonymous_namespace)::TreeNode>::resize
            (this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  this_03 = (SegmentTree *)&DAT_aaaaaaaaaaaaaaaa;
  puVar8 = &DAT_aaaaaaaaaaaaaaaa;
  bounds = (RectF *)0xffffffffffffffff;
  QList<int>::size((QList<int> *)(in_RDI + 1));
  uVar7 = 0;
  buildTree(this_03,(int)((ulong)puVar8 >> 0x20),(int)puVar8,-0x55555556,bounds);
  pTVar4 = QList<(anonymous_namespace)::TreeNode>::operator[]
                     (this_02,CONCAT44(uVar7,in_stack_ffffffffffffff78));
  *(SegmentTree **)((long)&pTVar4->index + 4) = this_03;
  *(undefined4 *)&pTVar4->leaf = 0xaaaaaaaa;
  pTVar4->lowestLeftIndex = -0x55555556;
  pTVar4->lowestRightIndex = (int)puVar8;
  (pTVar4->index).interval.first = (int)((ulong)puVar8 >> 0x20);
  pTVar4->splitLeft = -NAN;
  pTVar4->splitRight = (qreal)bounds;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SegmentTree::SegmentTree(QPathSegments &segments)
    : m_segments(segments),
      m_intersections(0)
{
    m_bounds.x1 = qt_inf();
    m_bounds.y1 = qt_inf();
    m_bounds.x2 = -qt_inf();
    m_bounds.y2 = -qt_inf();

    m_index.resize(m_segments.segments());

    for (int i = 0; i < m_index.size(); ++i) {
        m_index[i] = i;

        const QRectF &segmentBounds = m_segments.elementBounds(i);

        if (segmentBounds.left() < m_bounds.x1)
            m_bounds.x1 = segmentBounds.left();
        if (segmentBounds.top() < m_bounds.y1)
            m_bounds.y1 = segmentBounds.top();
        if (segmentBounds.right() > m_bounds.x2)
            m_bounds.x2 = segmentBounds.right();
        if (segmentBounds.bottom() > m_bounds.y2)
            m_bounds.y2 = segmentBounds.bottom();
    }

    m_tree.resize(1);

    TreeNode root = buildTree(0, m_index.size(), 0, m_bounds);
    m_tree[0] = root;
}